

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::InsertClockIRVisitor::visit(InsertClockIRVisitor *this,Generator *gen)

{
  Generator *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 left [8];
  undefined1 local_38 [8];
  shared_ptr<kratos::Port> parent_port;
  
  if ((((this->clk_en_ != (Port *)0x0) && (bVar2 = has_don_touch(&gen->super_IRNode), !bVar2)) &&
      ((gen->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (gen->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     ((((gen->is_external_ & 1U) == 0 && (gen->is_stub_ == false)) &&
      ((this_00 = gen->parent_generator_, this_00 != (Generator *)0x0 && (this->top_ != gen)))))) {
    bVar2 = Generator::has_port(gen,&this->clk_en_name_);
    if (bVar2) {
      Generator::get_port((Generator *)local_38,(string *)gen);
      left = local_38;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_port);
      iVar3 = (*(((Var *)left)->super_IRNode)._vptr_IRNode[0x10])(left);
      if (*(long *)(CONCAT44(extraout_var,iVar3) + 0x18) != 0) {
        lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x10);
        if (*(int *)(*(long *)(*(long *)(lVar1 + 8) + 200) + 0x168) != 3) {
          return;
        }
        std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_38,
                   (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 8));
        (*(((Var *)left)->super_IRNode)._vptr_IRNode[0x12])(left,1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_port);
      }
    }
    else {
      left = (undefined1  [8])Generator::port(gen,this->clk_en_,true);
      if (((Port *)left)->type_ != ClockEnable) {
        (*(((Port *)left)->super_Var).super_IRNode._vptr_IRNode[0x2b])(left,4);
      }
    }
    Generator::get_port((Generator *)local_38,(string *)this_00);
    Generator::wire(this_00,(Var *)left,(Var *)local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_port);
  }
  return;
}

Assistant:

void visit(Generator* gen) override {
        if (!clk_en_) return;
        if (has_don_touch(gen)) return;
        if (gen->external() || gen->is_stub()) return;
        auto* parent = gen->parent_generator();
        if (!parent || gen == top_) return;

        Port* clk_en;
        if (!gen->has_port(clk_en_name_)) {
            clk_en = &gen->port(*clk_en_);
            if (clk_en->port_type() != PortType::ClockEnable)
                clk_en->set_port_type(PortType::ClockEnable);
        } else {
            clk_en = gen->get_port(clk_en_name_).get();
            // notice that if it's being wired to a constant, we need to disconnect it
            auto const& sources = clk_en->sources();
            if (!sources.empty()) {
                if ((*(sources.begin()))->right()->type() == VarType::ConstValue) {
                    auto stmt = *(sources.begin());
                    clk_en->clear_sources(true);
                } else {
                    // no need to wire
                    return;
                }
            }
        }
        // wire to the top
        auto parent_port = parent->get_port(clk_en_name_);
        parent->wire(*clk_en, *parent_port);
    }